

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O0

void __thiscall
anurbs::NurbsSurfaceGeometry<2L>::NurbsSurfaceGeometry
          (NurbsSurfaceGeometry<2L> *this,Index degree_u,Index degree_v,VectorXd *knots_u,
          VectorXd *knots_v,Poles *poles,VectorXd *weights)

{
  Index IVar1;
  Index IVar2;
  Index IVar3;
  runtime_error *prVar4;
  Poles *poles_local;
  VectorXd *knots_v_local;
  VectorXd *knots_u_local;
  Index degree_v_local;
  Index degree_u_local;
  NurbsSurfaceGeometry<2L> *this_local;
  
  SurfaceBase<2L>::SurfaceBase(&this->super_SurfaceBase<2L>);
  (this->super_SurfaceBase<2L>)._vptr_SurfaceBase =
       (_func_int **)&PTR__NurbsSurfaceGeometry_00773f70;
  this->m_degree_u = degree_u;
  this->m_degree_v = degree_v;
  IVar1 = length<Eigen::Matrix<double,_1,1,0,_1,1>>(knots_u);
  IVar1 = Nurbs::nb_poles(degree_u,IVar1);
  this->m_nb_poles_u = IVar1;
  IVar1 = length<Eigen::Matrix<double,_1,1,0,_1,1>>(knots_v);
  IVar1 = Nurbs::nb_poles(degree_v,IVar1);
  this->m_nb_poles_v = IVar1;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->m_knots_u,knots_u);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->m_knots_v,knots_v);
  Eigen::Matrix<double,_-1,_2,_1,_-1,_2>::Matrix(&this->m_poles,poles);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->m_weights,weights);
  IVar1 = nb_poles_u(this);
  IVar2 = nb_poles_v(this);
  IVar3 = nb_poles(this);
  if (IVar1 * IVar2 != IVar3) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Number of knots and poles do not match");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  IVar1 = nb_poles(this);
  IVar2 = length<Eigen::Matrix<double,_1,1,0,_1,1>>(weights);
  if (IVar1 != IVar2) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Number of poles and weights do not match");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

NurbsSurfaceGeometry(
        const Index degree_u,
        const Index degree_v,
        const Eigen::VectorXd& knots_u,
        const Eigen::VectorXd& knots_v,
        const Poles& poles,
        const Eigen::VectorXd& weights)
        : m_degree_u(degree_u)
        , m_degree_v(degree_v)
        , m_nb_poles_u(Nurbs::nb_poles(degree_u, length(knots_u)))
        , m_nb_poles_v(Nurbs::nb_poles(degree_v, length(knots_v)))
        , m_knots_u(knots_u)
        , m_knots_v(knots_v)
        , m_poles(poles)
        , m_weights(weights)
    {
        static_assert(TDimension > 0);

        if (nb_poles_u() * nb_poles_v() != nb_poles()) {
            throw std::runtime_error("Number of knots and poles do not match");
        }

        if (nb_poles() != length(weights)) {
            throw std::runtime_error("Number of poles and weights do not match");
        }
    }